

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptutil.cpp
# Opt level: O2

void __thiscall
ScriptUtil_CreateMultisigRedeemScriptErrorTest_Test::TestBody
          (ScriptUtil_CreateMultisigRedeemScriptErrorTest_Test *this)

{
  bool bVar1;
  long lVar2;
  pointer pMVar3;
  initializer_list<cfd::core::Pubkey> __l;
  initializer_list<cfd::core::Pubkey> __l_00;
  initializer_list<cfd::core::Pubkey> __l_01;
  initializer_list<cfd::core::Pubkey> __l_02;
  initializer_list<MultisigTestVector> __l_03;
  allocator_type local_bba;
  allocator local_bb9;
  allocator_type local_bb8;
  allocator local_bb7;
  allocator local_bb6;
  allocator local_bb5;
  allocator local_bb4;
  allocator local_bb3;
  allocator local_bb2;
  allocator local_bb1;
  allocator local_bb0;
  allocator local_baf;
  allocator local_bae;
  allocator local_bad;
  allocator local_bac;
  allocator local_bab;
  allocator local_baa;
  allocator local_ba9;
  allocator local_ba8;
  allocator local_ba7;
  allocator local_ba6;
  allocator local_ba5;
  allocator local_ba4;
  allocator local_ba3;
  allocator local_ba2;
  allocator_type local_ba1;
  allocator local_ba0;
  allocator local_b9f;
  allocator local_b9e;
  allocator local_b9d;
  allocator local_b9c;
  allocator local_b9b;
  allocator local_b9a;
  allocator local_b99;
  allocator local_b98;
  allocator local_b97;
  allocator local_b96;
  allocator local_b95;
  allocator local_b94;
  allocator local_b93;
  allocator local_b92;
  allocator local_b91;
  allocator local_b90;
  allocator_type local_b8f;
  allocator local_b8e;
  allocator local_b8d;
  allocator local_b8c;
  allocator local_b8b;
  allocator_type local_b8a;
  allocator local_b89;
  string local_b88;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_b68;
  Pubkey local_b50;
  vector<MultisigTestVector,_std::allocator<MultisigTestVector>_> test_vectors;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_b20;
  string local_b08;
  string local_ae8;
  string local_ac8;
  string local_aa8;
  string local_a88;
  string local_a68;
  string local_a48;
  string local_a28;
  string local_a08;
  string local_9e8;
  string local_9c8;
  string local_9a8;
  string local_988;
  string local_968;
  string local_948;
  string local_928;
  string local_908;
  string local_8e8;
  string local_8c8;
  string local_8a8;
  string local_888;
  string local_868;
  string local_848;
  string local_828;
  string local_808;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  string local_788;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  AssertionResult gtest_ar;
  Pubkey local_610;
  Pubkey local_5f8;
  Pubkey local_5e0;
  Pubkey local_5c8;
  Pubkey local_5b0;
  Pubkey local_598;
  Pubkey local_580;
  Pubkey local_568;
  Pubkey local_550;
  Pubkey local_538;
  Pubkey local_520;
  Pubkey local_508;
  Pubkey local_4f0;
  Pubkey local_4d8;
  Pubkey local_4c0;
  Script actual;
  Pubkey local_460;
  Pubkey local_448;
  Pubkey local_430;
  Pubkey local_418;
  Pubkey local_400;
  Pubkey local_3e8;
  Pubkey local_3d0;
  Pubkey local_3b8;
  Pubkey local_3a0;
  Pubkey local_388;
  Pubkey local_370;
  Pubkey local_358;
  Pubkey local_340;
  Pubkey local_328;
  Pubkey local_310;
  Pubkey local_2f8;
  Pubkey local_2e0;
  Pubkey local_2c8;
  MultisigTestVector test_vector;
  Script local_210;
  string local_1d8 [32];
  undefined1 local_1b8;
  undefined4 local_1b0;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_1a8;
  Script local_190;
  string local_158 [32];
  undefined1 local_138;
  undefined4 local_130;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_128;
  Script local_110;
  string local_d8 [32];
  undefined1 local_b8;
  undefined4 local_b0;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_a8;
  Script local_90;
  string local_58 [32];
  undefined1 local_38;
  
  test_vector.req_sig = 0;
  std::__cxx11::string::string
            ((string *)&local_b88,
             "02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0",&local_b89);
  cfd::core::Pubkey::Pubkey((Pubkey *)&local_b20,&local_b88);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_b20;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&test_vector.input_pubkeys,__l,&local_b8a);
  cfd::core::Script::Script(&test_vector.expect_multisig_script);
  std::__cxx11::string::string
            ((string *)&test_vector.expect_message,"CreateMultisigScript require_num is 0.",
             &local_b8b);
  test_vector.is_witness = false;
  cfd::core::Script::Script(&local_210);
  std::__cxx11::string::string(local_1d8,"CreateMultisigScript empty pubkey array.",&local_b8c);
  local_1b8 = 0;
  local_1b0 = 3;
  std::__cxx11::string::string
            ((string *)&local_648,
             "02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0",&local_b8d);
  cfd::core::Pubkey::Pubkey((Pubkey *)&local_b68,&local_648);
  std::__cxx11::string::string
            ((string *)&local_668,
             "0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c",&local_b8e);
  cfd::core::Pubkey::Pubkey(&local_b50,&local_668);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_b68;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_1a8,__l_00,&local_b8f);
  cfd::core::Script::Script(&local_190);
  std::__cxx11::string::string(local_158,"CreateMultisigScript require_num is over.",&local_b90);
  local_138 = 0;
  local_130 = 1;
  std::__cxx11::string::string
            ((string *)&local_688,
             "02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0",&local_b91);
  cfd::core::Pubkey::Pubkey((Pubkey *)&gtest_ar,&local_688);
  std::__cxx11::string::string
            ((string *)&local_6a8,
             "0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c",&local_b92);
  cfd::core::Pubkey::Pubkey(&local_610,&local_6a8);
  std::__cxx11::string::string
            ((string *)&local_6c8,
             "024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82",&local_b93);
  cfd::core::Pubkey::Pubkey(&local_5f8,&local_6c8);
  std::__cxx11::string::string
            ((string *)&local_6e8,
             "03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38",&local_b94);
  cfd::core::Pubkey::Pubkey(&local_5e0,&local_6e8);
  std::__cxx11::string::string
            ((string *)&local_708,
             "020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1",&local_b95);
  cfd::core::Pubkey::Pubkey(&local_5c8,&local_708);
  std::__cxx11::string::string
            ((string *)&local_728,
             "0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147",&local_b96);
  cfd::core::Pubkey::Pubkey(&local_5b0,&local_728);
  std::__cxx11::string::string
            ((string *)&local_748,
             "0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c",&local_b97);
  cfd::core::Pubkey::Pubkey(&local_598,&local_748);
  std::__cxx11::string::string
            ((string *)&local_768,
             "020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9",&local_b98);
  cfd::core::Pubkey::Pubkey(&local_580,&local_768);
  std::__cxx11::string::string
            ((string *)&local_788,
             "0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37",&local_b99);
  cfd::core::Pubkey::Pubkey(&local_568,&local_788);
  std::__cxx11::string::string
            ((string *)&local_7a8,
             "0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e",&local_b9a);
  cfd::core::Pubkey::Pubkey(&local_550,&local_7a8);
  std::__cxx11::string::string
            ((string *)&local_7c8,
             "03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b",&local_b9b);
  cfd::core::Pubkey::Pubkey(&local_538,&local_7c8);
  std::__cxx11::string::string
            ((string *)&local_7e8,
             "02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd",&local_b9c);
  cfd::core::Pubkey::Pubkey(&local_520,&local_7e8);
  std::__cxx11::string::string
            ((string *)&local_808,
             "0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d",&local_b9d);
  cfd::core::Pubkey::Pubkey(&local_508,&local_808);
  std::__cxx11::string::string
            ((string *)&local_828,
             "0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2",&local_b9e);
  cfd::core::Pubkey::Pubkey(&local_4f0,&local_828);
  std::__cxx11::string::string
            ((string *)&local_848,
             "025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db",&local_b9f);
  cfd::core::Pubkey::Pubkey(&local_4d8,&local_848);
  std::__cxx11::string::string
            ((string *)&local_868,
             "030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55",&local_ba0);
  cfd::core::Pubkey::Pubkey(&local_4c0,&local_868);
  __l_01._M_len = 0x10;
  __l_01._M_array = (iterator)&gtest_ar;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_128,__l_01,&local_ba1);
  cfd::core::Script::Script(&local_110);
  std::__cxx11::string::string
            (local_d8,"CreateMultisigScript pubkeys array size is over.",&local_ba2);
  local_b8 = 0;
  local_b0 = 1;
  std::__cxx11::string::string
            ((string *)&local_888,
             "02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0",&local_ba3);
  cfd::core::Pubkey::Pubkey((Pubkey *)&actual,&local_888);
  std::__cxx11::string::string
            ((string *)&local_8a8,
             "0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c",&local_ba4);
  cfd::core::Pubkey::Pubkey
            ((Pubkey *)
             &actual.script_data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_8a8);
  std::__cxx11::string::string
            ((string *)&local_8c8,
             "024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82",&local_ba5);
  cfd::core::Pubkey::Pubkey
            ((Pubkey *)
             &actual.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_8c8);
  std::__cxx11::string::string
            ((string *)&local_8e8,
             "03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38",&local_ba6);
  cfd::core::Pubkey::Pubkey(&local_460,&local_8e8);
  std::__cxx11::string::string
            ((string *)&local_908,
             "020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1",&local_ba7);
  cfd::core::Pubkey::Pubkey(&local_448,&local_908);
  std::__cxx11::string::string
            ((string *)&local_928,
             "0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147",&local_ba8);
  cfd::core::Pubkey::Pubkey(&local_430,&local_928);
  std::__cxx11::string::string
            ((string *)&local_948,
             "0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c",&local_ba9);
  cfd::core::Pubkey::Pubkey(&local_418,&local_948);
  std::__cxx11::string::string
            ((string *)&local_968,
             "020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9",&local_baa);
  cfd::core::Pubkey::Pubkey(&local_400,&local_968);
  std::__cxx11::string::string
            ((string *)&local_988,
             "0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37",&local_bab);
  cfd::core::Pubkey::Pubkey(&local_3e8,&local_988);
  std::__cxx11::string::string
            ((string *)&local_9a8,
             "0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e",&local_bac);
  cfd::core::Pubkey::Pubkey(&local_3d0,&local_9a8);
  std::__cxx11::string::string
            ((string *)&local_9c8,
             "03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b",&local_bad);
  cfd::core::Pubkey::Pubkey(&local_3b8,&local_9c8);
  std::__cxx11::string::string
            ((string *)&local_9e8,
             "02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd",&local_bae);
  cfd::core::Pubkey::Pubkey(&local_3a0,&local_9e8);
  std::__cxx11::string::string
            ((string *)&local_a08,
             "0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d",&local_baf);
  cfd::core::Pubkey::Pubkey(&local_388,&local_a08);
  std::__cxx11::string::string
            ((string *)&local_a28,
             "0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2",&local_bb0);
  cfd::core::Pubkey::Pubkey(&local_370,&local_a28);
  std::__cxx11::string::string
            ((string *)&local_a48,
             "025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db",&local_bb1);
  cfd::core::Pubkey::Pubkey(&local_358,&local_a48);
  std::__cxx11::string::string
            ((string *)&local_a68,
             "030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55",&local_bb2);
  cfd::core::Pubkey::Pubkey(&local_340,&local_a68);
  std::__cxx11::string::string
            ((string *)&local_a88,
             "0267a49281bd9d6d366c39c62f2e95a2aab37638f2a4718891c542d0961962644e",&local_bb3);
  cfd::core::Pubkey::Pubkey(&local_328,&local_a88);
  std::__cxx11::string::string
            ((string *)&local_aa8,
             "02f48e8e2bcaeb16a6d781bb7a72f6250607bf21e32f08c48e37a9e4706e6d48b8",&local_bb4);
  cfd::core::Pubkey::Pubkey(&local_310,&local_aa8);
  std::__cxx11::string::string
            ((string *)&local_ac8,
             "03968ac57888ddaa3b57caa39efd5d5382c24f3deed602775cd4895f7c7adb5950",&local_bb5);
  cfd::core::Pubkey::Pubkey(&local_2f8,&local_ac8);
  std::__cxx11::string::string
            ((string *)&local_ae8,
             "024b64115bff6cc3718867114f7594fad535344f27ebe17ffa0e66288eb7bd2561",&local_bb6);
  cfd::core::Pubkey::Pubkey(&local_2e0,&local_ae8);
  std::__cxx11::string::string
            ((string *)&local_b08,
             "03f3aba2366b71f8473dd8dd4186005a9e3c6f9a32f76fc45493fd2a78b78c0d8d",&local_bb7);
  cfd::core::Pubkey::Pubkey(&local_2c8,&local_b08);
  __l_02._M_len = 0x15;
  __l_02._M_array = (iterator)&actual;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_a8,__l_02,&local_bb8);
  cfd::core::Script::Script(&local_90);
  std::__cxx11::string::string
            (local_58,"CreateMultisigScript pubkeys array size is over.",&local_bb9);
  local_38 = 1;
  __l_03._M_len = 5;
  __l_03._M_array = &test_vector;
  std::vector<MultisigTestVector,_std::allocator<MultisigTestVector>_>::vector
            (&test_vectors,__l_03,&local_bba);
  lVar2 = 0x200;
  do {
    MultisigTestVector::~MultisigTestVector
              ((MultisigTestVector *)((long)&test_vector.req_sig + lVar2));
    lVar2 = lVar2 + -0x80;
  } while (lVar2 != -0x80);
  lVar2 = 0x1e0;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&actual._vptr_Script + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  std::__cxx11::string::~string((string *)&local_b08);
  std::__cxx11::string::~string((string *)&local_ae8);
  std::__cxx11::string::~string((string *)&local_ac8);
  std::__cxx11::string::~string((string *)&local_aa8);
  std::__cxx11::string::~string((string *)&local_a88);
  std::__cxx11::string::~string((string *)&local_a68);
  std::__cxx11::string::~string((string *)&local_a48);
  std::__cxx11::string::~string((string *)&local_a28);
  std::__cxx11::string::~string((string *)&local_a08);
  std::__cxx11::string::~string((string *)&local_9e8);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::__cxx11::string::~string((string *)&local_9a8);
  std::__cxx11::string::~string((string *)&local_988);
  std::__cxx11::string::~string((string *)&local_968);
  std::__cxx11::string::~string((string *)&local_948);
  std::__cxx11::string::~string((string *)&local_928);
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::__cxx11::string::~string((string *)&local_888);
  lVar2 = 0x168;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               (&gtest_ar.success_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::~string((string *)&local_848);
  std::__cxx11::string::~string((string *)&local_828);
  std::__cxx11::string::~string((string *)&local_808);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::~string((string *)&local_768);
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::string::~string((string *)&local_708);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::__cxx11::string::~string((string *)&local_688);
  lVar2 = 0x18;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&local_b68._M_impl.super__Vector_impl_data._M_start + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  std::__cxx11::string::~string((string *)&local_668);
  std::__cxx11::string::~string((string *)&local_648);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_b20);
  std::__cxx11::string::~string((string *)&local_b88);
  cfd::core::Script::Script(&actual);
  for (pMVar3 = test_vectors.
                super__Vector_base<MultisigTestVector,_std::allocator<MultisigTestVector>_>._M_impl.
                super__Vector_impl_data._M_start;
      pMVar3 != test_vectors.
                super__Vector_base<MultisigTestVector,_std::allocator<MultisigTestVector>_>._M_impl.
                super__Vector_impl_data._M_finish; pMVar3 = pMVar3 + 1) {
    MultisigTestVector::MultisigTestVector(&test_vector,pMVar3);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ScriptUtil::CreateMultisigRedeemScript
                ((Script *)&gtest_ar,test_vector.req_sig,&test_vector.input_pubkeys,
                 test_vector.is_witness);
      cfd::core::Script::operator=(&actual,(Script *)&gtest_ar);
      cfd::core::Script::~Script((Script *)&gtest_ar);
    }
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
               ,0x18d,
               "Expected: (actual = ScriptUtil::CreateMultisigRedeemScript( test_vector.req_sig, test_vector.input_pubkeys, test_vector.is_witness)) throws an exception of type CfdException.\n  Actual: it throws nothing."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b68,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
    MultisigTestVector::~MultisigTestVector(&test_vector);
  }
  cfd::core::Script::~Script(&actual);
  std::vector<MultisigTestVector,_std::allocator<MultisigTestVector>_>::~vector(&test_vectors);
  return;
}

Assistant:

TEST(ScriptUtil, CreateMultisigRedeemScriptErrorTest) {
  const std::vector<MultisigTestVector> test_vectors = {
    // 0-of-1 Multisig
    {
      0,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
      },
      Script(),
      "CreateMultisigScript require_num is 0.",
      false
    },
    // 1-of-0 Multisig
    {
      1,
      {
      },
      Script(),
      "CreateMultisigScript empty pubkey array.",
      false
    },
    // 3-of-2 Multisig
    {
      3,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
      },
      Script(),
      "CreateMultisigScript require_num is over.",
      false
    },
    // 1-of-16 Multisig
    {
      1,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
        Pubkey("024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82"),
        Pubkey("03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38"),
        Pubkey("020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1"),
        Pubkey("0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147"),
        Pubkey("0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c"),
        Pubkey("020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9"),
        Pubkey("0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37"),
        Pubkey("0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e"),
        Pubkey("03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b"),
        Pubkey("02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd"),
        Pubkey("0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d"),
        Pubkey("0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2"),
        Pubkey("025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db"),
        Pubkey("030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55"),
      },
      Script(),
      "CreateMultisigScript pubkeys array size is over.",
      false
    },
    // 1-of-21 Multisig on witness
    {
      1,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
        Pubkey("024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82"),
        Pubkey("03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38"),
        Pubkey("020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1"),
        Pubkey("0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147"),
        Pubkey("0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c"),
        Pubkey("020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9"),
        Pubkey("0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37"),
        Pubkey("0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e"),
        Pubkey("03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b"),
        Pubkey("02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd"),
        Pubkey("0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d"),
        Pubkey("0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2"),
        Pubkey("025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db"),
        Pubkey("030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55"),
        Pubkey("0267a49281bd9d6d366c39c62f2e95a2aab37638f2a4718891c542d0961962644e"),
        Pubkey("02f48e8e2bcaeb16a6d781bb7a72f6250607bf21e32f08c48e37a9e4706e6d48b8"),
        Pubkey("03968ac57888ddaa3b57caa39efd5d5382c24f3deed602775cd4895f7c7adb5950"),
        Pubkey("024b64115bff6cc3718867114f7594fad535344f27ebe17ffa0e66288eb7bd2561"),
        Pubkey("03f3aba2366b71f8473dd8dd4186005a9e3c6f9a32f76fc45493fd2a78b78c0d8d"),
      },
      Script(),
      "CreateMultisigScript pubkeys array size is over.",
      true
    },
  };

  Script actual;
  for (MultisigTestVector test_vector : test_vectors) {
    try{
      EXPECT_THROW((actual = ScriptUtil::CreateMultisigRedeemScript(
          test_vector.req_sig, test_vector.input_pubkeys,
          test_vector.is_witness)), CfdException);
    } catch (CfdException &e) {
      EXPECT_STREQ(e.what(), test_vector.expect_message.c_str());
    }
  }
}